

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

bool __thiscall
glslang::TReflectionTraverser::visitBinary
          (TReflectionTraverser *this,TVisit param_1,TIntermBinary *node)

{
  TOperator TVar1;
  TIntermBinary *node_local;
  TVisit param_1_local;
  TReflectionTraverser *this_local;
  
  TVar1 = TIntermOperator::getOp(&node->super_TIntermOperator);
  if (TVar1 - EOpIndexDirect < 3) {
    addDereferencedUniform(this,node);
  }
  return true;
}

Assistant:

bool TReflectionTraverser::visitBinary(TVisit /* visit */, TIntermBinary* node)
{
    switch (node->getOp()) {
    case EOpIndexDirect:
    case EOpIndexIndirect:
    case EOpIndexDirectStruct:
        addDereferencedUniform(node);
        break;
    default:
        break;
    }

    // still need to visit everything below, which could contain sub-expressions
    // containing different uniforms
    return true;
}